

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strife_sbar.cpp
# Opt level: O0

void __thiscall FHealthBar::FHealthBar(FHealthBar *this)

{
  BYTE BVar1;
  long lVar2;
  int local_14;
  int i;
  FHealthBar *this_local;
  
  FTexture::FTexture(&this->super_FTexture,(char *)0x0,-1);
  (this->super_FTexture)._vptr_FTexture = (_func_int **)&PTR__FHealthBar_00a03b30;
  this->VialLevel = 0;
  this->NeedRefresh = false;
  (this->super_FTexture).Width = 200;
  (this->super_FTexture).Height = 2;
  (this->super_FTexture).WidthBits = '\b';
  (this->super_FTexture).HeightBits = '\x01';
  (this->super_FTexture).WidthMask = 0xff;
  for (local_14 = 0; local_14 < 8; local_14 = local_14 + 1) {
    lVar2 = (long)(local_14 * 3);
    BVar1 = FColorMatcher::Pick(&ColorMatcher,(uint)FHealthBar::rgbs[lVar2],
                                (uint)FHealthBar::rgbs[lVar2 + 1],(uint)FHealthBar::rgbs[lVar2 + 2])
    ;
    this->Colors[local_14] = BVar1;
  }
  return;
}

Assistant:

FHealthBar::FHealthBar ()
: VialLevel(0), NeedRefresh(false)
{
	int i;

	static const BYTE rgbs[8*3] =
	{
		180, 228, 128,	// light green
		128, 180, 80,	// dark green

		196, 204, 252,	// light blue
		148, 152, 200,	// dark blue

		224, 188, 0,	// light gold
		208, 128, 0,	// dark gold

		216, 44,  44,	// light red
		172, 28,  28	// dark red
	};

	Width = 200;
	Height = 2;
	WidthBits = 8;
	HeightBits = 1;
	WidthMask = 255;

	for (i = 0; i < 8; ++i)
	{
		Colors[i] = ColorMatcher.Pick (rgbs[i*3], rgbs[i*3+1], rgbs[i*3+2]);
	}
}